

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

ParseResults __thiscall
bubbleJson::BubbleJson::ParseStringRaw(BubbleJson *this,char **refString,size_t *refLength)

{
  char ch_00;
  BubbleContext **ppBVar1;
  ParseResults PVar2;
  char *pcVar3;
  char *size;
  void *pvVar4;
  char *pcStack_60;
  char ch;
  char *p;
  anon_class_16_2_f0ac0535 ReturnError;
  uint lowSurrogate;
  uint highSurrogate;
  size_t lenght;
  size_t originTop;
  BubbleContext *c;
  size_t *refLength_local;
  char **refString_local;
  BubbleJson *this_local;
  
  originTop = (size_t)this->context;
  ppBVar1 = (BubbleContext **)((BubbleContext *)originTop)->top;
  p = (char *)&originTop;
  ReturnError.c = ppBVar1;
  c = (BubbleContext *)refLength;
  refLength_local = (size_t *)refString;
  refString_local = (char **)this;
  Expect(this,'\"');
  pcStack_60 = *(char **)originTop;
  do {
    while( true ) {
      ch_00 = *pcStack_60;
      pcVar3 = pcStack_60 + 1;
      if (ch_00 == '\0') {
        *(BubbleContext ***)(originTop + 0x18) = ppBVar1;
        return ParseResult_MissQuotationMark;
      }
      if (ch_00 == '\"') {
        size = (char *)(*(long *)(originTop + 0x18) - (long)ppBVar1);
        pvVar4 = ContextPop(this,(size_t)size);
        *refLength_local = (size_t)pvVar4;
        c->json = size;
        *(char **)originTop = pcVar3;
        return ParseResult_Ok;
      }
      if (ch_00 == '\\') break;
      if (ch_00 < ' ') {
        *(BubbleContext ***)(originTop + 0x18) = ppBVar1;
        return ParseResult_InvalidStringChar;
      }
      ContextPushChar(this,ch_00);
      pcStack_60 = pcVar3;
    }
    pcStack_60 = pcStack_60 + 2;
    switch(*pcVar3) {
    case '\"':
      ContextPushChar(this,'\"');
      break;
    default:
      *(BubbleContext ***)(originTop + 0x18) = ppBVar1;
      return ParseResult_InvalidStringEscape;
    case '/':
      ContextPushChar(this,'/');
      break;
    case '\\':
      ContextPushChar(this,'\\');
      break;
    case 'b':
      ContextPushChar(this,'\b');
      break;
    case 'f':
      ContextPushChar(this,'\f');
      break;
    case 'n':
      ContextPushChar(this,'\n');
      break;
    case 'r':
      ContextPushChar(this,'\r');
      break;
    case 't':
      ContextPushChar(this,'\t');
      break;
    case 'u':
      pcStack_60 = ParseHexToInt(this,pcStack_60,(uint *)((long)&ReturnError.originTop + 4));
      if (pcStack_60 == (char *)0x0) {
        PVar2 = ParseStringRaw::anon_class_16_2_f0ac0535::operator()
                          ((anon_class_16_2_f0ac0535 *)&p,ParseResult_InvalidUnicodeHex);
        return PVar2;
      }
      if ((0xd7ff < ReturnError.originTop._4_4_) && (ReturnError.originTop._4_4_ < 0xdc00)) {
        if (*pcStack_60 != '\\') {
          PVar2 = ParseStringRaw::anon_class_16_2_f0ac0535::operator()
                            ((anon_class_16_2_f0ac0535 *)&p,ParseResult_InvalidUnicodeSurrogate);
          return PVar2;
        }
        if (pcStack_60[1] != 'u') {
          PVar2 = ParseStringRaw::anon_class_16_2_f0ac0535::operator()
                            ((anon_class_16_2_f0ac0535 *)&p,ParseResult_InvalidUnicodeSurrogate);
          return PVar2;
        }
        pcStack_60 = ParseHexToInt(this,pcStack_60 + 2,(uint *)&ReturnError.originTop);
        if (pcStack_60 == (char *)0x0) {
          PVar2 = ParseStringRaw::anon_class_16_2_f0ac0535::operator()
                            ((anon_class_16_2_f0ac0535 *)&p,ParseResult_InvalidUnicodeHex);
          return PVar2;
        }
        if (((uint)ReturnError.originTop < 0xdc00) || (0xdfff < (uint)ReturnError.originTop)) {
          PVar2 = ParseStringRaw::anon_class_16_2_f0ac0535::operator()
                            ((anon_class_16_2_f0ac0535 *)&p,ParseResult_InvalidUnicodeSurrogate);
          return PVar2;
        }
        ReturnError.originTop._4_4_ =
             ((ReturnError.originTop._4_4_ - 0xd800) * 0x400 | (uint)ReturnError.originTop - 0xdc00)
             + 0x10000;
      }
      EncodeUTF8(this,ReturnError.originTop._4_4_);
    }
  } while( true );
}

Assistant:

ParseResults BubbleJson::ParseStringRaw(char **refString, size_t *refLength)
{
    BubbleContext* c = this->context;
    size_t originTop = c->top;
    size_t lenght;
    unsigned highSurrogate, lowSurrogate;

    auto ReturnError = [=,&c](ParseResults parseResult){
        c->top = originTop;
        return parseResult;
    };

    Expect('\"');
    const char* p = c->json;
    while (true)
    {
        //traverse json
        char ch = *p;
        p++;
        switch (ch)
        {
            case '\"':
                lenght = c->top - originTop;
                *refString = (char *) ContextPop(lenght);
                *refLength = lenght;
                //current p point '\"' character
                c->json = p;
                return ParseResult_Ok;
            case '\\':
                switch (*p++) {
                    case '\"':
                        ContextPushChar('\"'); break;
                    case '\\':
                        ContextPushChar('\\'); break;
                    case '/':
                        ContextPushChar('/'); break;
                    case 'b':
                        ContextPushChar('\b'); break;
                    case 'f':
                        ContextPushChar('\f'); break;
                    case 'n':
                        ContextPushChar('\n'); break;
                    case 'r':
                        ContextPushChar('\r'); break;
                    case 't':
                        ContextPushChar('\t'); break;
                    case 'u':
                        if (!(p = ParseHexToInt(p, &highSurrogate)))
                            return ReturnError(ParseResult_InvalidUnicodeHex);
                        if (highSurrogate >= 0xD800 && highSurrogate <= 0xDBFF)//surrogate pair
                        {
                            if (*p++ != '\\')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (*p++ != 'u')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (!(p = ParseHexToInt(p, &lowSurrogate)))
                                return ReturnError(ParseResult_InvalidUnicodeHex);
                            if (lowSurrogate < 0xDC00 || lowSurrogate > 0xDFFF)
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            highSurrogate = (((highSurrogate - 0xD800) << 10) | (lowSurrogate - 0xDC00)) + 0x10000;
                        }
                        EncodeUTF8(highSurrogate);
                        break;
                    default:
                        c->top = originTop;
                        return ParseResult_InvalidStringEscape;
                }
                break;
            case '\0':
                c->top = originTop;
                return ParseResult_MissQuotationMark;
            default:
                if (ch < 0x20)
                {
                    c->top = originTop;
                    return ParseResult_InvalidStringChar;
                }
                ContextPushChar(ch);
        }
    }
}